

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::setIconSize(QAbstractItemView *this,QSize *size)

{
  QAbstractItemViewPrivate *this_00;
  undefined4 in_EAX;
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  iVar2 = -(uint)((this_00->iconSize).wd.m_i == (*size).wd.m_i);
  iVar3 = -(uint)((this_00->iconSize).ht.m_i == (*size).ht.m_i);
  auVar1._4_4_ = iVar2;
  auVar1._0_4_ = iVar2;
  auVar1._8_4_ = iVar3;
  auVar1._12_4_ = iVar3;
  iVar2 = movmskpd(in_EAX,auVar1);
  if (iVar2 == 3) {
    return;
  }
  this_00->iconSize = *size;
  QAbstractItemViewPrivate::doDelayedItemsLayout(this_00,0);
  iconSizeChanged(this,size);
  return;
}

Assistant:

void QAbstractItemView::setIconSize(const QSize &size)
{
    Q_D(QAbstractItemView);
    if (size == d->iconSize)
        return;
    d->iconSize = size;
    d->doDelayedItemsLayout();
    emit iconSizeChanged(size);
}